

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

int cvui::internal::input
              (cvui_block_t *theBlock,int theX,int theY,int theWidth,String *theName,
              String *theContent,double theFontScale,bool theUpdateLayout)

{
  bool theFocused;
  int iVar1;
  int iVar2;
  Size_<int> local_7c;
  Size_<int> local_74;
  Size aSize;
  Size aTextSize;
  int key;
  int aInputAreaInteraction;
  bool aFocused;
  Rect aRect;
  int aPadding;
  Size aContentSize;
  bool theUpdateLayout_local;
  double theFontScale_local;
  String *theContent_local;
  String *theName_local;
  int theWidth_local;
  int theY_local;
  int theX_local;
  cvui_block_t *theBlock_local;
  
  cv::getTextSize((string *)&aRect.height,(int)theContent,theFontScale,0,(int *)0x1);
  aRect.width = aPadding / 2;
  iVar1 = render::getScreenCharWidth(theFontScale);
  cv::Rect_<int>::Rect_
            ((Rect_<int> *)&aInputAreaInteraction,theX,theY,theWidth - iVar1,
             aPadding + 2 + aRect.width * 2);
  theFocused = inputUpdateFocus(theX,theY,theName,(Rect *)&aInputAreaInteraction);
  iVar1 = cvui::iarea(theX,theY,aRect.x,aRect.y);
  iVar2 = inputUpdateCursor(theWidth,theContent,theFontScale,theFocused);
  inputUpdateCursorBlink();
  if (theUpdateLayout) {
    cv::getTextSize((string *)&aSize,(int)theContent,theFontScale,0,(int *)0x1);
    cv::Size_<int>::Size_(&local_74,theWidth,aSize.height + aRect.width * 2);
    cv::Size_<int>::Size_(&local_7c,&aSize);
    updateLayoutFlow(theBlock,&local_7c);
  }
  render::input(theBlock,(Rect *)&aInputAreaInteraction,theContent,theFontScale,iVar1,theFocused);
  return iVar2;
}

Assistant:

int input(cvui_block_t& theBlock, int theX, int theY, int theWidth, const cv::String theName, cv::String& theContent, double theFontScale, bool theUpdateLayout) {
		cv::Size aContentSize = cv::getTextSize(theContent, cv::FONT_HERSHEY_SIMPLEX, theFontScale, 1, nullptr);
		int aPadding = aContentSize.height / 2;
        cv::Rect aRect(theX, theY, theWidth - render::getScreenCharWidth(theFontScale), aContentSize.height + 2 + aPadding * 2);

        bool aFocused = inputUpdateFocus(theX, theY, theName, aRect);
        int aInputAreaInteraction = cvui::iarea(theX, theY, aRect.width, aRect.height);        

        int key = inputUpdateCursor(theWidth, theContent, theFontScale, aFocused);
        inputUpdateCursorBlink();

		// Update the layout flow according to input size if we were told to update.
		if (theUpdateLayout) {
            cv::Size aTextSize = cv::getTextSize(theContent, cv::FONT_HERSHEY_SIMPLEX, theFontScale, 1, nullptr);
			cv::Size aSize(theWidth, aTextSize.height + aPadding * 2);
			updateLayoutFlow(theBlock, aTextSize);
		}

        render::input(theBlock, aRect, theContent, theFontScale, aInputAreaInteraction, aFocused);

        return key;
	}